

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O3

void Acb_NtkPrintCecStats(Acb_Ntk_t *pNtk)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  lVar2 = (long)(pNtk->vObjType).nSize;
  uVar5 = 0;
  uVar4 = 0;
  if (1 < lVar2) {
    uVar4 = 0;
    lVar3 = 1;
    uVar5 = 0;
    do {
      bVar1 = (pNtk->vObjType).pArray[lVar3];
      if ((4 < bVar1) || ((0x19U >> (bVar1 & 0x1f) & 1) == 0)) {
        if (bVar1 == 0x4e) {
          uVar5 = uVar5 + 1;
        }
        else {
          uVar4 = uVar4 + (bVar1 == 0x15);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  printf("PI = %6d  ",(ulong)(uint)(pNtk->vCis).nSize);
  printf("PO = %6d  ",(ulong)(uint)(pNtk->vCos).nSize);
  printf("Obj = %6d  ",(ulong)((pNtk->vObjType).nSize - 1));
  printf("DC = %4d  ",(ulong)uVar5);
  printf("Mux = %4d  ",(ulong)uVar4);
  putchar(10);
  return;
}

Assistant:

void Acb_NtkPrintCecStats( Acb_Ntk_t * pNtk )
{
    int iObj, nDcs = 0, nMuxes = 0;
    Acb_NtkForEachNode( pNtk, iObj )
        if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_TRI )
            nDcs++;
        else if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_BIT_MUX )
            nMuxes++;

    printf( "PI = %6d  ",  Acb_NtkCiNum(pNtk) );
    printf( "PO = %6d  ",  Acb_NtkCoNum(pNtk) );
    printf( "Obj = %6d  ", Acb_NtkObjNum(pNtk) );
    printf( "DC = %4d  ",  nDcs );
    printf( "Mux = %4d  ", nMuxes );
    printf( "\n" );
}